

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void detect_glsl_version(void)

{
  GLenum GVar1;
  char *pcVar2;
  GLubyte *local_18;
  char *str;
  GLenum enumval;
  
  ctx->glsl_minor = 0;
  ctx->glsl_major = 0;
  if ((ctx->have_core_opengl != 0) &&
     ((ctx->have_opengl_2 != 0 ||
      ((((ctx->have_GL_ARB_shader_objects != 0 && (ctx->have_GL_ARB_vertex_shader != 0)) &&
        (ctx->have_GL_ARB_fragment_shader != 0)) && (ctx->have_GL_ARB_shading_language_100 != 0)))))
     ) {
    (*ctx->glGetError)();
    local_18 = (*ctx->glGetString)(0x8b8c);
    GVar1 = (*ctx->glGetError)();
    if (GVar1 == 0x500) {
      local_18 = (GLubyte *)0x0;
    }
    pcVar2 = strstr((char *)local_18,"OpenGL ES GLSL ");
    if (pcVar2 != (char *)0x0) {
      local_18 = local_18 + 0xf;
    }
    pcVar2 = strstr((char *)local_18,"ES ");
    if (pcVar2 != (char *)0x0) {
      local_18 = local_18 + 3;
    }
    parse_opengl_version_str((char *)local_18,&ctx->glsl_major,&ctx->glsl_minor);
  }
  return;
}

Assistant:

static void detect_glsl_version(void)
{
    ctx->glsl_major = ctx->glsl_minor = 0;

#if SUPPORT_PROFILE_GLSL
    if (!ctx->have_core_opengl)
        return;  // everything's busted, give up.

    #if PLATFORM_MACOSX
    // If running on Mac OS X <= 10.4, don't ever use GLSL, even if
    //  the system claims it is available.
    if (!macosx_version_atleast(10, 5, 0))
        return;
    #endif

    if ( ctx->have_opengl_2 ||
         ( ctx->have_GL_ARB_shader_objects &&
           ctx->have_GL_ARB_vertex_shader &&
           ctx->have_GL_ARB_fragment_shader &&
           ctx->have_GL_ARB_shading_language_100 ) )
    {
        // the GL2.0 and ARB enum is the same value.
        const GLenum enumval = GL_SHADING_LANGUAGE_VERSION;
        ctx->glGetError();  // flush any existing error state.
        const char *str = (const char *) ctx->glGetString(enumval);
        if (ctx->glGetError() == GL_INVALID_ENUM)
            str = NULL;
        if (strstr(str, "OpenGL ES GLSL "))
            str += 15;
        if (strstr(str, "ES "))
            str += 3;
        parse_opengl_version_str(str, &ctx->glsl_major, &ctx->glsl_minor);
    } // if
#endif
}